

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O3

void __thiscall Analyser::modifyInstruction(Analyser *this,int32_t index,Instruction *ins)

{
  int32_t iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  long lVar4;
  string *psVar6;
  long lVar7;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  if ((long)this->_currentFunction != -1) {
    uVar3 = ins->_opr;
    uVar5 = ins->_x;
    iVar1 = ins->_y;
    lVar4 = *(long *)&(this->_instructions).
                      super__Vector_base<std::vector<Instruction,_std::allocator<Instruction>_>,_std::allocator<std::vector<Instruction,_std::allocator<Instruction>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[this->_currentFunction].
                      super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
                      super__Vector_impl_data;
    lVar7 = (long)index * 0x10;
    *(undefined4 *)(lVar4 + lVar7) = uVar3;
    *(undefined4 *)(lVar4 + 4 + lVar7) = uVar5;
    *(int32_t *)(lVar4 + 8 + lVar7) = iVar1;
    return;
  }
  psVar6 = (string *)__cxa_allocate_exception(0x28);
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"can not call MI in start code","");
  iVar2 = this->_currentLine;
  *(string **)psVar6 = psVar6 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar6,local_40,local_40 + local_38);
  *(long *)(psVar6 + 0x20) = (long)iVar2;
  __cxa_throw(psVar6,&Error::typeinfo,Error::~Error);
}

Assistant:

void Analyser::modifyInstruction(const std::int32_t index, const Instruction& ins)
{
	if (_currentFunction == -1) {
		throw Error("can not call MI in start code", _currentLine);
	}
	_instructions[_currentFunction][index] = ins;
}